

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert
          (CopyPropagateArrays *this,Instruction *insert_inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  DefUseManager *this_00;
  TypeManager *this_01;
  Type *type;
  pointer pMVar6;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar7;
  const_reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  pointer other;
  Instruction *in_RDX;
  value_type local_78;
  AccessChainEntry current_last_access;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  current_memory_object;
  undefined8 uStack_60;
  uint32_t i;
  Instruction *current_insert;
  AccessChainEntry last_access;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  uint32_t number_of_elements;
  Type *result_type;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  Instruction *insert_inst_local;
  CopyPropagateArrays *this_local;
  
  OVar2 = opt::Instruction::opcode(in_RDX);
  if (OVar2 != OpCompositeInsert) {
    __assert_fail("insert_inst->opcode() == spv::Op::OpCompositeInsert && \"Expecting an OpCompositeInsert instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x194,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction *)"
                 );
  }
  pIVar5 = Pass::context((Pass *)insert_inst);
  this_00 = IRContext::get_def_use_mgr(pIVar5);
  pIVar5 = Pass::context((Pass *)insert_inst);
  this_01 = IRContext::get_type_mgr(pIVar5);
  uVar3 = opt::Instruction::type_id(in_RDX);
  type = analysis::TypeManager::GetType(this_01,uVar3);
  pIVar5 = Pass::context((Pass *)insert_inst);
  uVar3 = anon_unknown_0::GetNumberOfMembers(type,pIVar5);
  if (uVar3 == 0) {
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,(nullptr_t)0x0);
  }
  else {
    uVar4 = opt::Instruction::NumInOperands(in_RDX);
    if (uVar4 == 3) {
      uVar4 = opt::Instruction::GetSingleWordInOperand(in_RDX,2);
      if (uVar4 == uVar3 - 1) {
        opt::Instruction::GetSingleWordInOperand(in_RDX,0);
        GetSourceObjectIfAny((CopyPropagateArrays *)&last_access.field_1,(uint32_t)insert_inst);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&last_access.field_1);
        if (bVar1) {
          pMVar6 = std::
                   unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                   ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 *)&last_access.field_1);
          bVar1 = MemoryObject::IsMember(pMVar6);
          if (bVar1) {
            pMVar6 = std::
                     unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                     ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                   *)&last_access.field_1);
            pvVar7 = MemoryObject::AccessChain(pMVar6);
            pvVar8 = std::
                     vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     ::back(pvVar7);
            unique0x00012000 = *pvVar8;
            bVar1 = IsAccessChainIndexValidAndEqualTo
                              ((CopyPropagateArrays *)insert_inst,
                               (AccessChainEntry *)((long)&current_insert + 4),uVar3 - 1);
            if (bVar1) {
              pMVar6 = std::
                       unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                     *)&last_access.field_1);
              MemoryObject::PopIndirection(pMVar6);
              uVar4 = opt::Instruction::GetSingleWordInOperand(in_RDX,1);
              uStack_60 = analysis::DefUseManager::GetDef(this_00,uVar4);
              do {
                current_memory_object._M_t.
                super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                _M_head_impl._4_4_ = uVar3 - 1;
                if (current_memory_object._M_t.
                    super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                    .
                    super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                  ::unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                *)this,(unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                        *)&last_access.field_1);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                  break;
                }
                OVar2 = opt::Instruction::opcode((Instruction *)uStack_60);
                if (OVar2 != OpCompositeInsert) {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  ::
                  unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                            ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                              *)this,(nullptr_t)0x0);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                  break;
                }
                uVar4 = opt::Instruction::NumInOperands((Instruction *)uStack_60);
                if (uVar4 != 3) {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  ::
                  unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                            ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                              *)this,(nullptr_t)0x0);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                  break;
                }
                uVar4 = opt::Instruction::GetSingleWordInOperand((Instruction *)uStack_60,2);
                if (uVar4 != uVar3 - 2) {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  ::
                  unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                            ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                              *)this,(nullptr_t)0x0);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                  break;
                }
                opt::Instruction::GetSingleWordInOperand((Instruction *)uStack_60,0);
                GetSourceObjectIfAny
                          ((CopyPropagateArrays *)&current_last_access,(uint32_t)insert_inst);
                bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&current_last_access);
                if (bVar1) {
                  pMVar6 = std::
                           unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                           ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                         *)&current_last_access);
                  bVar1 = MemoryObject::IsMember(pMVar6);
                  if (bVar1) {
                    pMVar6 = std::
                             unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                           *)&last_access.field_1);
                    pvVar7 = MemoryObject::AccessChain(pMVar6);
                    sVar9 = std::
                            vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                            ::size(pvVar7);
                    pMVar6 = std::
                             unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                           *)&current_last_access);
                    pvVar7 = MemoryObject::AccessChain(pMVar6);
                    sVar10 = std::
                             vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                             ::size(pvVar7);
                    if (sVar9 + 1 == sVar10) {
                      pMVar6 = std::
                               unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                             *)&last_access.field_1);
                      other = std::
                              unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                              ::get((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                     *)&current_last_access);
                      bVar1 = MemoryObject::Contains(pMVar6,other);
                      if (bVar1) {
                        pMVar6 = std::
                                 unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                 ::operator->((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                               *)&current_last_access);
                        pvVar7 = MemoryObject::AccessChain(pMVar6);
                        pvVar8 = std::
                                 vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                                 ::back(pvVar7);
                        local_78 = *pvVar8;
                        bVar1 = IsAccessChainIndexValidAndEqualTo
                                          ((CopyPropagateArrays *)insert_inst,&local_78,uVar3 - 2);
                        if (bVar1) {
                          uVar3 = opt::Instruction::GetSingleWordInOperand
                                            ((Instruction *)uStack_60,1);
                          uStack_60 = analysis::DefUseManager::GetDef(this_00,uVar3);
                          last_access.is_result_id = false;
                          last_access._1_3_ = 0;
                        }
                        else {
                          std::
                          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                          ::
                          unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                                    ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                                      *)this,(nullptr_t)0x0);
                          last_access.is_result_id = true;
                          last_access._1_3_ = 0;
                        }
                      }
                      else {
                        std::
                        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                        ::
                        unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                                  ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                                    *)this,(nullptr_t)0x0);
                        last_access.is_result_id = true;
                        last_access._1_3_ = 0;
                      }
                    }
                    else {
                      std::
                      unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                      ::
                      unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                                ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                                  *)this,(nullptr_t)0x0);
                      last_access.is_result_id = true;
                      last_access._1_3_ = 0;
                    }
                  }
                  else {
                    std::
                    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                    ::
                    unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                                *)this,(nullptr_t)0x0);
                    last_access.is_result_id = true;
                    last_access._1_3_ = 0;
                  }
                }
                else {
                  std::
                  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  ::
                  unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                            ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                              *)this,(nullptr_t)0x0);
                  last_access.is_result_id = true;
                  last_access._1_3_ = 0;
                }
                std::
                unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                               *)&current_last_access);
                uVar3 = current_memory_object._M_t.
                        super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                        .
                        super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                        ._M_head_impl._4_4_;
              } while (last_access._0_4_ == 0);
            }
            else {
              std::
              unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
              ::
              unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                        ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                          *)this,(nullptr_t)0x0);
              last_access.is_result_id = true;
              last_access._1_3_ = 0;
            }
          }
          else {
            std::
            unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
            ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                      ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                        *)this,(nullptr_t)0x0);
            last_access.is_result_id = true;
            last_access._1_3_ = 0;
          }
        }
        else {
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
          ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                    ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                      *)this,(nullptr_t)0x0);
          last_access.is_result_id = true;
          last_access._1_3_ = 0;
        }
        std::
        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                       *)&last_access.field_1);
      }
      else {
        std::
        unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
        ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                  ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                    *)this,(nullptr_t)0x0);
      }
    }
    else {
      std::
      unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
      ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
                ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                  *)this,(nullptr_t)0x0);
    }
  }
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction* insert_inst) {
  assert(insert_inst->opcode() == spv::Op::OpCompositeInsert &&
         "Expecting an OpCompositeInsert instruction.");

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(insert_inst->type_id());

  uint32_t number_of_elements = GetNumberOfMembers(result_type, context());

  if (number_of_elements == 0) {
    return nullptr;
  }

  if (insert_inst->NumInOperands() != 3) {
    return nullptr;
  }

  if (insert_inst->GetSingleWordInOperand(2) != number_of_elements - 1) {
    return nullptr;
  }

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(insert_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, number_of_elements - 1)) {
    return nullptr;
  }

  memory_object->PopIndirection();

  Instruction* current_insert =
      def_use_mgr->GetDef(insert_inst->GetSingleWordInOperand(1));
  for (uint32_t i = number_of_elements - 1; i > 0; --i) {
    if (current_insert->opcode() != spv::Op::OpCompositeInsert) {
      return nullptr;
    }

    if (current_insert->NumInOperands() != 3) {
      return nullptr;
    }

    if (current_insert->GetSingleWordInOperand(2) != i - 1) {
      return nullptr;
    }

    std::unique_ptr<MemoryObject> current_memory_object =
        GetSourceObjectIfAny(current_insert->GetSingleWordInOperand(0));

    if (!current_memory_object) {
      return nullptr;
    }

    if (!current_memory_object->IsMember()) {
      return nullptr;
    }

    if (memory_object->AccessChain().size() + 1 !=
        current_memory_object->AccessChain().size()) {
      return nullptr;
    }

    if (!memory_object->Contains(current_memory_object.get())) {
      return nullptr;
    }

    AccessChainEntry current_last_access =
        current_memory_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(current_last_access, i - 1)) {
      return nullptr;
    }
    current_insert =
        def_use_mgr->GetDef(current_insert->GetSingleWordInOperand(1));
  }

  return memory_object;
}